

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O1

int av1_interinter_compound_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,int_mv *cur_mv,BLOCK_SIZE bsize,PREDICTION_MODE this_mode
              )

{
  INTERINTER_COMPOUND_DATA *comp_data;
  undefined8 *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  MB_MODE_INFO **ppMVar6;
  MB_MODE_INFO *pMVar7;
  MB_MODE_INFO *pMVar8;
  int iVar9;
  int iVar10;
  MV *pMVar11;
  uint8_t *puVar12;
  ulong uVar13;
  ulong uVar14;
  int dst_stride;
  InterpFilterParams *pIVar15;
  bool bVar16;
  int tmp_rate_mv;
  undefined8 local_8198;
  uint local_818c;
  int local_8188;
  int local_8184;
  ulong local_8180;
  ulong local_8178;
  int local_8170;
  undefined4 uStack_816c;
  MV *local_8168;
  uint8_t *local_8160;
  MV *local_8158;
  ulong local_8150;
  uint8_t *local_8148;
  ulong local_8140;
  uint8_t *local_8138;
  uint8_t *puStack_8130;
  scale_factors sf;
  InterPredParams local_8110;
  uint8_t local_8038 [32776];
  
  ppMVar6 = (x->e_mbd).mi;
  pMVar7 = *ppMVar6;
  tmp_rate_mv = 0;
  comp_data = &pMVar7->interinter_comp;
  if ((pMVar7->interinter_comp).type == '\0') {
    puVar12 = (uint8_t *)0x0;
  }
  else {
    puVar12 = (x->e_mbd).seg_mask;
  }
  comp_data->seg_mask = puVar12;
  if (this_mode == '\x18') {
    bVar2 = block_size_wide[bsize];
    puVar12 = av1_get_compound_type_mask(comp_data,(*ppMVar6)->bsize);
    local_8198 = *(undefined8 *)cur_mv;
    av1_joint_motion_search
              (cpi,x,bsize,(int_mv *)&local_8198,puVar12,(uint)bVar2,&tmp_rate_mv,
               (uint)((cpi->sf).mv_sf.disable_second_mv == 0),
               ((cpi->sf).inter_sf.enable_fast_compound_mode_search != 2) + 1);
    *(undefined8 *)pMVar7->mv = local_8198;
  }
  else if ((byte)(this_mode - 0x13) < 4) {
    bVar16 = (0x1280000UL >> ((ulong)this_mode & 0x3f) & 1) != 0;
    uVar13 = (ulong)bsize;
    local_8180 = (ulong)block_size_wide[uVar13];
    local_8178 = uVar13;
    local_8148 = av1_get_compound_type_mask(comp_data,(*ppMVar6)->bsize);
    local_8198 = *(undefined8 *)cur_mv;
    local_8160 = (uint8_t *)((ulong)local_8038 >> 1);
    if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
      local_8160 = local_8038;
    }
    local_8140 = (ulong)((uint)bVar16 * 4);
    local_8158 = (MV *)((long)&local_8198 + local_8140);
    local_8168 = (MV *)((long)&local_8198 + (ulong)(bVar16 ^ 1) * 4);
    local_818c = (uint)block_size_high[uVar13];
    iVar3 = (x->e_mbd).mi_col;
    iVar9 = (x->e_mbd).plane[0].subsampling_x;
    pMVar8 = *(x->e_mbd).mi;
    iVar4 = (x->e_mbd).mi_row;
    iVar10 = (x->e_mbd).plane[0].subsampling_y;
    uVar13 = (ulong)((bVar16 ^ 1) << 5);
    puVar1 = (undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].buf + uVar13);
    local_8138 = (uint8_t *)*puVar1;
    puStack_8130 = (uint8_t *)puVar1[1];
    local_8188 = *(int *)((long)&(x->e_mbd).plane[0].pre[0].width + uVar13);
    local_8184 = *(int *)((long)&(x->e_mbd).plane[0].pre[0].height + uVar13);
    _local_8170 = *(undefined8 *)((long)&(x->e_mbd).plane[0].pre[0].stride + uVar13);
    local_8150 = (ulong)bVar16;
    av1_setup_scale_factors_for_frame
              (&sf,local_8188,local_8184,(cpi->common).width,(cpi->common).height);
    puVar12 = local_8160;
    uVar13 = local_8178;
    local_8110.subsampling_x = (x->e_mbd).plane[0].subsampling_x;
    local_8110.subsampling_y = (x->e_mbd).plane[0].subsampling_y;
    local_8110.bit_depth = (x->e_mbd).bd;
    local_8110.use_hbd_buf = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
    uVar5 = (pMVar8->interp_filters).as_int;
    dst_stride = (int)local_8180;
    local_8110.block_height = local_818c;
    local_8110.is_intrabc = 0;
    local_8110.mode = TRANSLATION_PRED;
    local_8110.comp_mode = UNIFORM_SINGLE;
    local_8110.top = (0x120U >> ((byte)local_8110.subsampling_y & 0x1f)) * -0x400 + 0x1000;
    local_8110.left = (0x120U >> ((byte)local_8110.subsampling_x & 0x1f)) * -0x400 + 0x1000;
    uVar14 = (ulong)(uVar5 >> 0xc & 0xff0);
    pIVar15 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar14);
    local_8110.interp_filter_params[0] =
         (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar14);
    if ((char)(uVar5 >> 0x10) == '\x04') {
      local_8110.interp_filter_params[0] = pIVar15;
    }
    if ((0x10003UL >> (local_8178 & 0x3f) & 1) == 0) {
      local_8110.interp_filter_params[0] = pIVar15;
    }
    uVar14 = (ulong)((uVar5 & 0xff) << 4);
    pIVar15 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar14);
    local_8110.interp_filter_params[1] =
         (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar14);
    if ((char)uVar5 == '\x04') {
      local_8110.interp_filter_params[1] = pIVar15;
    }
    if ((0x20005UL >> (local_8178 & 0x3f) & 1) == 0) {
      local_8110.interp_filter_params[1] = pIVar15;
    }
    local_8110.scale_factors = &sf;
    local_8110.ref_frame_buf.buf = local_8138;
    local_8110.ref_frame_buf.buf0 = puStack_8130;
    local_8110.ref_frame_buf.width = local_8188;
    local_8110.conv_params.round_0 = 3;
    if (10 < local_8110.bit_depth) {
      local_8110.conv_params.round_0 = local_8110.bit_depth + -7;
    }
    local_8110.ref_frame_buf.height = local_8184;
    local_8110.conv_params.round_1 = 0xb;
    if (10 < local_8110.bit_depth) {
      local_8110.conv_params.round_1 = 0x15 - local_8110.bit_depth;
    }
    local_8110.ref_frame_buf.stride = local_8170;
    local_8110.ref_frame_buf._28_4_ = uStack_816c;
    local_8110.conv_params.do_average = 0;
    local_8110.conv_params.dst = (CONV_BUF_TYPE *)0x0;
    local_8110.conv_params.dst_stride = 0;
    local_8110.conv_params.plane = 0;
    local_8110.conv_params.is_compound = 0;
    local_8110.conv_params.use_dist_wtd_comp_avg = 0;
    local_8110.block_width = dst_stride;
    local_8110.pix_row = (iVar4 << 2) >> ((byte)iVar10 & 0x1f);
    local_8110.pix_col = (iVar3 << 2) >> ((byte)iVar9 & 0x1f);
    av1_enc_build_one_inter_predictor(local_8160,dst_stride,local_8168,&local_8110);
    pMVar11 = local_8158;
    av1_compound_single_motion_search
              (cpi,x,(BLOCK_SIZE)uVar13,local_8158,puVar12,local_8148,dst_stride,&tmp_rate_mv,
               (int)local_8150);
    *(MV *)((long)pMVar7->mv + local_8140) = *pMVar11;
  }
  return tmp_rate_mv;
}

Assistant:

int av1_interinter_compound_motion_search(const AV1_COMP *const cpi,
                                          MACROBLOCK *x,
                                          const int_mv *const cur_mv,
                                          const BLOCK_SIZE bsize,
                                          const PREDICTION_MODE this_mode) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int_mv tmp_mv[2];
  int tmp_rate_mv = 0;
  // TODO(jingning): The average compound mode has proper SAD and variance
  // functions implemented, and is triggerd by setting the mask pointer as
  // Null. Need to further implement those for frame distance weighted mode.
  mbmi->interinter_comp.seg_mask =
      mbmi->interinter_comp.type == COMPOUND_AVERAGE ? NULL : xd->seg_mask;
  const INTERINTER_COMPOUND_DATA *compound_data = &mbmi->interinter_comp;

  if (this_mode == NEW_NEWMV) {
    do_masked_motion_search_indexed(cpi, x, cur_mv, compound_data, bsize,
                                    tmp_mv, &tmp_rate_mv, 2);
    mbmi->mv[0].as_int = tmp_mv[0].as_int;
    mbmi->mv[1].as_int = tmp_mv[1].as_int;
  } else if (this_mode >= NEAREST_NEWMV && this_mode <= NEW_NEARMV) {
    // which = 1 if this_mode == NEAREST_NEWMV || this_mode == NEAR_NEWMV
    // which = 0 if this_mode == NEW_NEARESTMV || this_mode == NEW_NEARMV
    int which = (NEWMV == compound_ref1_mode(this_mode));
    do_masked_motion_search_indexed(cpi, x, cur_mv, compound_data, bsize,
                                    tmp_mv, &tmp_rate_mv, which);
    mbmi->mv[which].as_int = tmp_mv[which].as_int;
  }
  return tmp_rate_mv;
}